

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O1

Vector<int,_4> deqp::gles3::Functional::FboTestUtil::castVectorSaturate<int>(Vec4 *in)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  undefined4 *in_RDI;
  int iVar5;
  Vector<int,_4> VVar6;
  
  fVar1 = in->m_data[0];
  iVar2 = 0x7fffffff;
  uVar3 = 0x7fffffff;
  if ((fVar1 + 0.5 < 2.1474836e+09) && (uVar3 = 0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    uVar3 = (ulong)(uint)(int)fVar1;
  }
  fVar1 = in->m_data[1];
  if ((fVar1 + 0.5 < 2.1474836e+09) && (iVar2 = -0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    iVar2 = (int)fVar1;
  }
  fVar1 = in->m_data[2];
  iVar4 = 0x7fffffff;
  iVar5 = 0x7fffffff;
  if ((fVar1 + 0.5 < 2.1474836e+09) && (iVar5 = -0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    iVar5 = (int)fVar1;
  }
  fVar1 = in->m_data[3];
  if ((fVar1 + 0.5 < 2.1474836e+09) && (iVar4 = -0x80000000, -2.1474836e+09 < fVar1 + -0.5)) {
    iVar4 = (int)fVar1;
  }
  *in_RDI = (int)uVar3;
  in_RDI[1] = iVar2;
  in_RDI[2] = iVar5;
  in_RDI[3] = iVar4;
  VVar6.m_data[2] = (int)uVar3;
  VVar6.m_data[3] = (int)(uVar3 >> 0x20);
  VVar6.m_data._0_8_ = in_RDI;
  return (Vector<int,_4>)VVar6.m_data;
}

Assistant:

static tcu::Vector<T, 4> castVectorSaturate (const tcu::Vec4& in)
{
	return tcu::Vector<T, 4>((in.x() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.x() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.x()))),
	                         (in.y() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.y() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.y()))),
							 (in.z() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.z() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.z()))),
							 (in.w() + 0.5f >= std::numeric_limits<T>::max()) ? (std::numeric_limits<T>::max()) : ((in.w() - 0.5f <= std::numeric_limits<T>::min()) ? (std::numeric_limits<T>::min()) : (T(in.w()))));
}